

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O0

edgeTy __thiscall Apt::GetPosEdgeType(Apt *this,positionTy *_pos,size_t *_pIdxE)

{
  int iVar1;
  const_reference this_00;
  long *in_RDX;
  size_type in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  positionTy basePos;
  size_t idxE;
  vecIdxTy *in_stack_00000248;
  double in_stack_00000250;
  double in_stack_00000258;
  double in_stack_00000260;
  positionTy *in_stack_00000268;
  positionTy *in_stack_00000270;
  Apt *in_stack_00000278;
  size_type in_stack_ffffffffffffff38;
  vector<TaxiEdge,_std::allocator<TaxiEdge>_> *in_stack_ffffffffffffff40;
  long local_28;
  edgeTy local_4;
  
  local_28 = *(long *)(in_RSI + 0x40);
  if (local_28 == -1) {
    local_28 = *(long *)(in_RSI + 0x40);
    iVar1 = DataRefs::GetFdSnapTaxiDist_m(&dataRefs);
    in_stack_ffffffffffffff40 = (vector<TaxiEdge,_std::allocator<TaxiEdge>_> *)(double)iVar1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1bb8bb);
    FindClosestEdge(in_stack_00000278,in_stack_00000270,in_stack_00000268,in_stack_00000260,
                    in_stack_00000258,in_stack_00000250,in_stack_00000248);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_RDI);
    in_stack_ffffffffffffff38 = in_RSI;
  }
  if (in_RDX != (long *)0x0) {
    *in_RDX = local_28;
  }
  if (local_28 == -2) {
    local_4 = UNKNOWN_WAY;
  }
  else {
    this_00 = std::vector<TaxiEdge,_std::allocator<TaxiEdge>_>::at
                        (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    local_4 = TaxiEdge::GetType(this_00);
  }
  return local_4;
}

Assistant:

TaxiEdge::edgeTy GetPosEdgeType (const positionTy& _pos, size_t* _pIdxE = nullptr) const
    {
        // Haven't yet analysed this position?
        size_t idxE = _pos.edgeIdx;
        if (idxE == EDGE_UNKNOWN) {
            // Find the closest edge and update idxE
            positionTy basePos = _pos;
            FindClosestEdge(_pos, basePos,
                            dataRefs.GetFdSnapTaxiDist_m(),
                            ART_EDGE_ANGLE_TOLERANCE,
                            ART_EDGE_ANGLE_TOLERANCE_EXT);
            idxE = basePos.edgeIdx;
        }
        
        // return the edge's index if requested
        if (_pIdxE) *_pIdxE = idxE;
        
        // position is analyzed, but no edge found?
        if (idxE == EDGE_UNAVAIL)
            return TaxiEdge::UNKNOWN_WAY;
        
        // return the edge's type
        return vecTaxiEdges.at(idxE).GetType();
    }